

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int fileIn(FILE *fp)

{
  byte bVar1;
  uint8_t version;
  FILE *fp_local;
  
  bVar1 = get_image_version(fp);
  switch(bVar1) {
  case 0:
    info_impl("fileIn",99,"Reading in version 0 image.");
    fp_local._4_4_ = fileIn_version_0(fp);
    break;
  case 1:
    info_impl("fileIn",0x68,"Reading in version 1 image.");
    fp_local._4_4_ = fileIn_version_1(fp);
    break;
  case 2:
    info_impl("fileIn",0x6d,"Reading in version 2 image.");
    fp_local._4_4_ = fileIn_version_2(fp);
    break;
  case 3:
    info_impl("fileIn",0x72,"Reading in version 3 image.");
    fp_local._4_4_ = fileIn_version_3(fp);
    break;
  default:
    error_impl("fileIn",0x77,"Unsupported image file version: %u.",(ulong)bVar1);
    fp_local._4_4_ = 0;
  }
  return fp_local._4_4_;
}

Assistant:

int fileIn(FILE *fp)
{
    uint8_t version = get_image_version(fp);

    switch(version) {
    case IMAGE_VERSION_0:
        info("Reading in version 0 image.");
        return fileIn_version_0(fp);
        break;

    case IMAGE_VERSION_1:
        info("Reading in version 1 image.");
        return fileIn_version_1(fp);
        break;

    case IMAGE_VERSION_2:
        info("Reading in version 2 image.");
        return fileIn_version_2(fp);
        break;

    case IMAGE_VERSION_3:
        info("Reading in version 3 image.");
        return fileIn_version_3(fp);
        break;

    default:
        error("Unsupported image file version: %u.", version);
        break;
    }

    return 0;
}